

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

int genBiomeNoiseScaled(BiomeNoise *bn,int *out,Range r,uint64_t sha)

{
  Range r_00;
  undefined1 auVar1 [20];
  Range r_01;
  Range RVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *out_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int local_6c;
  int local_68;
  int local_64;
  BiomeNoise *local_60;
  Range s;
  
  RVar2 = r;
  if (r.sy == 0) {
    r.sy = 1;
  }
  auVar1 = RVar2._0_20_;
  local_60 = bn;
  if (r.scale == 1) {
    uVar9 = (ulong)r.sx;
    uVar8 = (ulong)r.sz;
    uVar6 = (long)r.sy * uVar9 * uVar8;
    r_00.sy = r.sy;
    r_00.y = r.y;
    r_00.scale = auVar1._0_4_;
    r_00.x = auVar1._4_4_;
    r_00.z = auVar1._8_4_;
    r_00.sx = auVar1._12_4_;
    r_00.sz = auVar1._16_4_;
    getVoronoiSrcRange(r_00);
    if (uVar6 < 2) {
      out_00 = (int *)0x0;
    }
    else {
      out_00 = out + uVar6;
      r_01.sy = s.sy;
      r_01.y = s.y;
      r_01.x = s.x;
      r_01.scale = s.scale;
      r_01.z = s.z;
      r_01.sx = s.sx;
      r_01.sz = s.sz;
      genBiomeNoise3D(local_60,out_00,r_01,0);
    }
    for (iVar4 = 0; iVar4 < r.sy; iVar4 = iVar4 + 1) {
      for (iVar5 = 0; iVar5 < (int)uVar8; iVar5 = iVar5 + 1) {
        for (iVar7 = 0; iVar7 < (int)uVar9; iVar7 = iVar7 + 1) {
          voronoiAccess3D(sha,r.x + iVar7,r.y + iVar4,r.z + iVar5,&local_64,&local_6c,&local_68);
          if (out_00 == (int *)0x0) {
            iVar3 = sampleBiomeNoise(local_60,(int64_t *)0x0,local_64,local_6c,local_68,
                                     (uint64_t *)0x0,0);
          }
          else {
            iVar3 = out_00[((long)s.sz * ((long)local_6c - (long)s.y) + ((long)local_68 - (long)s.z)
                           ) * (long)s.sx + ((long)local_64 - (long)s.x)];
          }
          *out = iVar3;
          out = out + 1;
          uVar9 = (ulong)(uint)r.sx;
        }
        uVar8 = (ulong)(uint)r.sz;
      }
    }
  }
  else {
    RVar2.sy = r.sy;
    RVar2.y = r.y;
    RVar2.scale = auVar1._0_4_;
    RVar2.x = auVar1._4_4_;
    RVar2.z = auVar1._8_4_;
    RVar2.sx = auVar1._12_4_;
    RVar2.sz = auVar1._16_4_;
    genBiomeNoise3D(bn,out,RVar2,(uint)(4 < r.scale));
  }
  return 0;
}

Assistant:

int genBiomeNoiseScaled(const BiomeNoise *bn, int *out, Range r, uint64_t sha)
{
    if (r.sy == 0)
        r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;
    int i, j, k;

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            genBiomeNoise3D(bn, src, s, 0);
        }
        else
        {
            src = NULL;
        }

        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = sampleBiomeNoise(bn, 0, x4, y4, z4, 0, 0);
                    }
                    p++;
                }
            }
        }
    }
    else
    {
        // There is (was?) an optimization that causes MC-241546, and should
        // not be enabled for accurate results. However, if the scale is higher
        // than 1:4, the accuracy becomes questionable anyway. Furthermore
        // situations that want to use a higher scale are usually better off
        // with a faster, if imperfect, result.
        genBiomeNoise3D(bn, out, r, r.scale > 4);
    }
    return 0;
}